

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O0

int ffinttyp(char *cval,int *dtype,int *negative,int *status)

{
  int iVar1;
  size_t sVar2;
  ushort **ppuVar3;
  char *local_40;
  char *p;
  int len;
  int ii;
  int *status_local;
  int *negative_local;
  int *dtype_local;
  char *cval_local;
  
  if (*status < 1) {
    *dtype = 0;
    *negative = 0;
    if (*cval == '+') {
      local_40 = cval + 1;
    }
    else {
      local_40 = cval;
      if (*cval == '-') {
        local_40 = cval + 1;
        *negative = 1;
      }
    }
    if (*local_40 == '0') {
      for (; *local_40 == '0'; local_40 = local_40 + 1) {
      }
      if (*local_40 == '\0') {
        *dtype = 0xc;
        return *status;
      }
    }
    sVar2 = strlen(local_40);
    iVar1 = (int)sVar2;
    for (p._4_4_ = 0; p._4_4_ < iVar1; p._4_4_ = p._4_4_ + 1) {
      ppuVar3 = __ctype_b_loc();
      if (((*ppuVar3)[(int)local_40[p._4_4_]] & 0x800) == 0) {
        *status = 0x193;
        return *status;
      }
    }
    if (iVar1 == 0) {
      *status = 0xcc;
    }
    else if (iVar1 < 3) {
      *dtype = 0xc;
    }
    else if (iVar1 == 4) {
      *dtype = 0x15;
    }
    else if ((iVar1 < 6) || (9 < iVar1)) {
      if ((iVar1 < 0xb) || (0x12 < iVar1)) {
        if (iVar1 < 0x15) {
          if (*negative == 0) {
            if (iVar1 == 3) {
              iVar1 = strcmp(local_40,"127");
              if (iVar1 < 1) {
                *dtype = 0xc;
              }
              else {
                iVar1 = strcmp(local_40,"255");
                if (iVar1 < 1) {
                  *dtype = 0xb;
                }
                else {
                  *dtype = 0x15;
                }
              }
            }
            else if (iVar1 == 5) {
              iVar1 = strcmp(local_40,"32767");
              if (iVar1 < 1) {
                *dtype = 0x15;
              }
              else {
                iVar1 = strcmp(local_40,"65535");
                if (iVar1 < 1) {
                  *dtype = 0x14;
                }
                else {
                  *dtype = 0x1f;
                }
              }
            }
            else if (iVar1 == 10) {
              iVar1 = strcmp(local_40,"2147483647");
              if (iVar1 < 1) {
                *dtype = 0x1f;
              }
              else {
                iVar1 = strcmp(local_40,"4294967295");
                if (iVar1 < 1) {
                  *dtype = 0x1e;
                }
                else {
                  *dtype = 0x51;
                }
              }
            }
            else if (iVar1 == 0x13) {
              iVar1 = strcmp(local_40,"9223372036854775807");
              if (iVar1 < 1) {
                *dtype = 0x51;
              }
              else {
                *dtype = 0x50;
              }
            }
            else if (iVar1 == 0x14) {
              iVar1 = strcmp(local_40,"18446744073709551615");
              if (iVar1 < 1) {
                *dtype = 0x50;
              }
              else {
                *status = 0x193;
              }
            }
          }
          else if (iVar1 == 3) {
            iVar1 = strcmp(local_40,"128");
            if (iVar1 < 1) {
              *dtype = 0xc;
            }
            else {
              *dtype = 0x15;
            }
          }
          else if (iVar1 == 5) {
            iVar1 = strcmp(local_40,"32768");
            if (iVar1 < 1) {
              *dtype = 0x15;
            }
            else {
              *dtype = 0x1f;
            }
          }
          else if (iVar1 == 10) {
            iVar1 = strcmp(local_40,"2147483648");
            if (iVar1 < 1) {
              *dtype = 0x1f;
            }
            else {
              *dtype = 0x51;
            }
          }
          else if (iVar1 == 0x13) {
            iVar1 = strcmp(local_40,"9223372036854775808");
            if (iVar1 < 1) {
              *dtype = 0x51;
            }
            else {
              *status = 0x193;
            }
          }
        }
        else {
          *status = 0x193;
        }
      }
      else {
        *dtype = 0x51;
      }
    }
    else {
      *dtype = 0x1f;
    }
    cval_local._4_4_ = *status;
  }
  else {
    cval_local._4_4_ = *status;
  }
  return cval_local._4_4_;
}

Assistant:

int ffinttyp(char *cval,  /* I - formatted string representation of the integer */
           int *dtype, /* O - datatype code: TBYTE, TSHORT, TUSHORT, etc */
           int *negative, /* O - is cval negative? */
           int *status)  /* IO - error status */
/*
  determine implicit datatype of input integer string.
  This assumes that the string conforms to the FITS standard
  for integer keyword value, so may not detect all invalid formats.
*/
{
    int ii, len;
    char *p;

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    *dtype = 0;  /* initialize to NULL */
    *negative = 0;
    p = cval;

    if (*p == '+') {
        p++;   /* ignore leading + sign */
    } else if (*p == '-') {
        p++;
	*negative = 1;   /* this is a negative number */
    }

    if (*p == '0') {
        while (*p == '0') p++;  /* skip leading zeros */

        if (*p == 0) {  /* the value is a string of 1 or more zeros */
           *dtype  = TSBYTE;
	   return(*status);
        }
    }

    len = strlen(p);
    for (ii = 0; ii < len; ii++)  {
        if (!isdigit(*(p+ii))) {
	    *status = BAD_INTKEY;
	    return(*status);
	}
    }

    /* check for unambiguous cases, based on length of the string */
    if (len == 0) {
        *status = VALUE_UNDEFINED;
    } else if (len < 3) {
        *dtype = TSBYTE;
    } else if (len == 4) {
	*dtype = TSHORT;
    } else if (len > 5 && len < 10) {
        *dtype = TINT;
    } else if (len > 10 && len < 19) {
        *dtype = TLONGLONG;
    } else if (len > 20) {
	*status = BAD_INTKEY;
    } else {
    
      if (!(*negative)) {  /* positive integers */
	if (len == 3) {
	    if (strcmp(p,"127") <= 0 ) {
	        *dtype = TSBYTE;
	    } else if (strcmp(p,"255") <= 0 ) {
	        *dtype = TBYTE;
	    } else {
	        *dtype = TSHORT;
	    }
	} else if (len == 5) {
 	    if (strcmp(p,"32767") <= 0 ) {
	        *dtype = TSHORT;
 	    } else if (strcmp(p,"65535") <= 0 ) {
	        *dtype = TUSHORT;
	    } else {
	        *dtype = TINT;
	    }
	} else if (len == 10) {
	    if (strcmp(p,"2147483647") <= 0 ) {
	        *dtype = TINT;
	    } else if (strcmp(p,"4294967295") <= 0 ) {
	        *dtype = TUINT;
	    } else {
	        *dtype = TLONGLONG;
	    }
	} else if (len == 19) {
	    if (strcmp(p,"9223372036854775807") <= 0 ) {
	        *dtype = TLONGLONG;
	    } else {
		*dtype = TULONGLONG;
	    }
	} else if (len == 20) {
	    if (strcmp(p,"18446744073709551615") <= 0 ) {
	        *dtype = TULONGLONG;
	    } else {
	        *status = BAD_INTKEY;
	    }
	}

      } else {  /* negative integers */
	if (len == 3) {
	    if (strcmp(p,"128") <= 0 ) {
	        *dtype = TSBYTE;
	    } else {
	        *dtype = TSHORT;
	    }
	} else if (len == 5) {
 	    if (strcmp(p,"32768") <= 0 ) {
	        *dtype = TSHORT;
	    } else {
	        *dtype = TINT;
	    }
	} else if (len == 10) {
	    if (strcmp(p,"2147483648") <= 0 ) {
	        *dtype = TINT;
	    } else {
	        *dtype = TLONGLONG;
	    }
	} else if (len == 19) {
	    if (strcmp(p,"9223372036854775808") <= 0 ) {
	        *dtype = TLONGLONG;
	    } else {
		*status = BAD_INTKEY;
	    }
	}
      }
    }

    return(*status);
}